

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O0

void __thiscall
nuraft::raft_server::yield_leadership(raft_server *this,bool immediate_yield,int successor_id)

{
  bool bVar1;
  __int_type_conflict1 _Var2;
  int32 iVar3;
  int iVar4;
  element_type *peVar5;
  element_type *peVar6;
  pointer ppVar7;
  uint64_t uVar8;
  srv_config *psVar9;
  string *psVar10;
  undefined8 uVar11;
  size_t ms;
  uint in_EDX;
  byte in_SIL;
  long in_RDI;
  uint64_t pp_last_resp_ms;
  ptr<peer> *pp_1;
  int32 srv_id_1;
  pair<const_int,_std::shared_ptr<nuraft::peer>_> *entry_1;
  iterator __end2;
  iterator __begin2;
  unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
  *__range2;
  ptr<peer> *pp;
  int32 srv_id;
  iterator entry;
  size_t hb_interval_ms;
  string candidate_endpoint;
  uint64_t last_resp_ms;
  int candidate_id;
  int max_priority;
  unique_lock<std::recursive_mutex> guard;
  unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
  *in_stack_fffffffffffffd38;
  undefined1 uVar12;
  timer_helper *in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd4c;
  timer_helper *in_stack_fffffffffffffd50;
  uint in_stack_fffffffffffffd58;
  int in_stack_fffffffffffffd5c;
  raft_server *in_stack_fffffffffffffd90;
  raft_server *in_stack_fffffffffffffdd0;
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  string local_158 [32];
  string local_138 [32];
  ulong local_118;
  shared_ptr<nuraft::peer> *local_110;
  uint local_104;
  reference local_100;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_f8;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_f0;
  long local_e8;
  shared_ptr<nuraft::peer> *local_e0;
  uint local_d4;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_d0;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_c8 [3];
  ulong local_b0;
  string local_a8 [32];
  ulong local_88;
  uint local_7c;
  uint local_78;
  undefined4 local_74;
  string local_70 [64];
  string local_30 [32];
  uint local_10;
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_10 = in_EDX;
  bVar1 = std::atomic::operator_cast_to_bool
                    ((atomic<bool> *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
  if ((!bVar1) &&
     (iVar4 = *(int *)(in_RDI + 0x38),
     _Var2 = std::__atomic_base::operator_cast_to_int
                       ((__atomic_base<int> *)
                        CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48)),
     iVar4 == _Var2)) {
    iVar3 = get_num_voting_members(in_stack_fffffffffffffd90);
    if (iVar3 < 2) {
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar1) {
        peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x15032d);
        iVar4 = (**(code **)(*(long *)peVar5 + 0x38))();
        if (1 < iVar4) {
          peVar5 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x150353);
          msg_if_given_abi_cxx11_
                    ((char *)local_30,"this node is the only node in the cluster, will do nothing");
          (**(code **)(*(long *)peVar5 + 0x40))
                    (peVar5,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                     ,"yield_leadership",0x4a1,local_30);
          std::__cxx11::string::~string(local_30);
        }
      }
    }
    else {
      std::unique_lock<std::recursive_mutex>::unique_lock
                ((unique_lock<std::recursive_mutex> *)in_stack_fffffffffffffd40,
                 (mutex_type *)in_stack_fffffffffffffd38);
      if ((local_9 & 1) == 0) {
        local_78 = 0;
        local_7c = 0xffffffff;
        local_88 = 0;
        std::__cxx11::string::string(local_a8);
        std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
                  ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x1505ab);
        context::get_params((context *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58)
                           );
        peVar6 = std::
                 __shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1505ca);
        iVar4 = *(int *)(peVar6 + 8);
        std::shared_ptr<nuraft::raft_params>::~shared_ptr
                  ((shared_ptr<nuraft::raft_params> *)0x1505e3);
        local_b0 = (long)iVar4;
        if (-1 < (int)local_10) {
          local_c8[0]._M_cur =
               (__node_type *)
               std::
               unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
               ::find(in_stack_fffffffffffffd38,(key_type *)0x15061d);
          local_d0._M_cur =
               (__node_type *)
               std::
               unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
               ::end(in_stack_fffffffffffffd38);
          bVar1 = std::__detail::operator!=(local_c8,&local_d0);
          if (bVar1) {
            ppVar7 = std::__detail::
                     _Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                     ::operator->((_Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                                   *)0x150686);
            local_d4 = ppVar7->first;
            ppVar7 = std::__detail::
                     _Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                     ::operator->((_Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                                   *)0x15069c);
            local_e0 = &ppVar7->second;
            std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1506b5);
            psVar9 = peer::get_config((peer *)0x1506bd);
            local_78 = srv_config::get_priority(psVar9);
            local_7c = local_d4;
            std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x150706);
            psVar9 = peer::get_config((peer *)0x15070e);
            psVar10 = srv_config::get_endpoint_abi_cxx11_(psVar9);
            std::__cxx11::string::operator=(local_a8,(string *)psVar10);
            std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x150753);
            uVar8 = peer::get_resp_timer_us((peer *)0x15075b);
            local_88 = uVar8 / 1000;
          }
        }
        if (local_7c == 0xffffffff) {
          local_e8 = in_RDI + 0x1e0;
          local_f0._M_cur =
               (__node_type *)
               std::
               unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
               ::begin(in_stack_fffffffffffffd38);
          local_f8._M_cur =
               (__node_type *)
               std::
               unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
               ::end(in_stack_fffffffffffffd38);
          while (bVar1 = std::__detail::operator!=(&local_f0,&local_f8), bVar1) {
            local_100 = std::__detail::
                        _Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                        ::operator*((_Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                                     *)0x150815);
            local_104 = local_100->first;
            local_110 = &local_100->second;
            std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x15084f);
            uVar8 = peer::get_resp_timer_us((peer *)0x150857);
            local_118 = uVar8 / 1000;
            if ((local_104 != *(uint *)(in_RDI + 0x38)) && (local_118 <= local_b0)) {
              std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1508b6);
              psVar9 = peer::get_config((peer *)0x1508be);
              iVar3 = srv_config::get_priority(psVar9);
              if ((int)local_78 < iVar3) {
                std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1508f9);
                psVar9 = peer::get_config((peer *)0x150901);
                local_78 = srv_config::get_priority(psVar9);
                local_7c = local_104;
                std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x15093e);
                psVar9 = peer::get_config((peer *)0x150946);
                psVar10 = srv_config::get_endpoint_abi_cxx11_(psVar9);
                std::__cxx11::string::operator=(local_a8,(string *)psVar10);
                local_88 = local_118;
              }
            }
            std::__detail::
            _Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::
            operator++((_Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                        *)in_stack_fffffffffffffd40);
          }
        }
        uVar12 = (undefined1)((ulong)in_stack_fffffffffffffd38 >> 0x38);
        if ((int)local_10 < 0) {
          bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
          if (bVar1) {
            peVar5 = std::
                     __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x150bdc);
            iVar4 = (**(code **)(*(long *)peVar5 + 0x38))();
            if (3 < iVar4) {
              peVar5 = std::
                       __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x150c0f);
              msg_if_given_abi_cxx11_
                        ((char *)local_178,"got graceful re-elect request, pause write from now");
              (**(code **)(*(long *)peVar5 + 0x40))
                        (peVar5,4,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                         ,"yield_leadership",0x4e1,local_178);
              std::__cxx11::string::~string(local_178);
            }
          }
        }
        else {
          bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
          if (bVar1) {
            peVar5 = std::
                     __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1509d7);
            iVar4 = (**(code **)(*(long *)peVar5 + 0x38))();
            if (3 < iVar4) {
              peVar5 = std::
                       __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x150a0a);
              msg_if_given_abi_cxx11_
                        ((char *)local_138,
                         "got graceful re-elect request (designated successor %d), pause write from now"
                         ,(ulong)local_10);
              (**(code **)(*(long *)peVar5 + 0x40))
                        (peVar5,4,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                         ,"yield_leadership",0x4d9,local_138);
              std::__cxx11::string::~string(local_138);
            }
          }
          if (((-1 < (int)local_10) && (local_10 != local_7c)) &&
             (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318)),
             bVar1)) {
            peVar5 = std::
                     __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x150ae7);
            iVar4 = (**(code **)(*(long *)peVar5 + 0x38))();
            if (2 < iVar4) {
              peVar5 = std::
                       __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x150b1a);
              msg_if_given_abi_cxx11_
                        ((char *)local_158,"could not find given successor %d",(ulong)local_10);
              (**(code **)(*(long *)peVar5 + 0x40))
                        (peVar5,3,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                         ,"yield_leadership",0x4dd,local_158);
              std::__cxx11::string::~string(local_158);
            }
          }
        }
        if ((int)local_7c < 0) {
          bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
          if (bVar1) {
            peVar5 = std::
                     __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x150e09);
            iVar4 = (**(code **)(*(long *)peVar5 + 0x38))();
            if (2 < iVar4) {
              in_stack_fffffffffffffd40 =
                   (timer_helper *)
                   std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x150e3c);
              msg_if_given_abi_cxx11_
                        ((char *)local_1b8,
                         "cannot find valid candidate for next leader, will proceed anyway");
              (**(code **)((long)&((mutex_type *)(in_stack_fffffffffffffd40->t_created_).__d.__r)[1]
                                  .super___recursive_mutex_base._M_mutex + 0x18))
                        (in_stack_fffffffffffffd40,3,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                         ,"yield_leadership",0x4eb,local_1b8);
              std::__cxx11::string::~string(local_1b8);
            }
          }
        }
        else {
          bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
          if (bVar1) {
            peVar5 = std::
                     __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x150cd3);
            in_stack_fffffffffffffd5c = (**(code **)(*(long *)peVar5 + 0x38))();
            if (3 < in_stack_fffffffffffffd5c) {
              in_stack_fffffffffffffd50 =
                   (timer_helper *)
                   std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x150d06);
              in_stack_fffffffffffffd58 = local_7c;
              uVar11 = std::__cxx11::string::c_str();
              msg_if_given_abi_cxx11_
                        ((char *)local_198,
                         "next leader candidate: id %d endpoint %s priority %d last response %lu ms ago"
                         ,(ulong)in_stack_fffffffffffffd58,uVar11,(ulong)local_78,local_88);
              (**(code **)((in_stack_fffffffffffffd50->t_created_).__d.__r + 0x40))
                        (in_stack_fffffffffffffd50,4,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                         ,"yield_leadership",0x4e8,local_198);
              std::__cxx11::string::~string(local_198);
            }
          }
          std::__atomic_base<int>::operator=
                    ((__atomic_base<int> *)
                     CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                     (__int_type_conflict1)((ulong)in_stack_fffffffffffffd40 >> 0x20));
        }
        std::atomic<bool>::operator=((atomic<bool> *)in_stack_fffffffffffffd40,(bool)uVar12);
        ms = in_RDI + 0x108;
        std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
                  ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x150efb);
        context::get_params((context *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58)
                           );
        std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x150f1a);
        timer_helper::set_duration_ms(in_stack_fffffffffffffd40,ms);
        std::shared_ptr<nuraft::raft_params>::~shared_ptr
                  ((shared_ptr<nuraft::raft_params> *)0x150f35);
        timer_helper::reset(in_stack_fffffffffffffd50);
        std::__cxx11::string::~string(local_a8);
        local_74 = 0;
      }
      else {
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
        uVar12 = (undefined1)((ulong)in_stack_fffffffffffffd38 >> 0x38);
        if (bVar1) {
          peVar5 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x150442);
          iVar4 = (**(code **)(*(long *)peVar5 + 0x38))();
          if (3 < iVar4) {
            peVar5 = std::
                     __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x15047b);
            msg_if_given_abi_cxx11_((char *)local_70,"got immediate re-elect request, resign now");
            (**(code **)(*(long *)peVar5 + 0x40))
                      (peVar5,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                       ,"yield_leadership",0x4a8,local_70);
            std::__cxx11::string::~string(local_70);
          }
        }
        std::__atomic_base<int>::operator=
                  ((__atomic_base<int> *)
                   CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                   (__int_type_conflict1)((ulong)in_stack_fffffffffffffd40 >> 0x20));
        become_follower(in_stack_fffffffffffffdd0);
        std::atomic<bool>::operator=((atomic<bool> *)in_stack_fffffffffffffd40,(bool)uVar12);
        local_74 = 1;
      }
      std::unique_lock<std::recursive_mutex>::~unique_lock
                ((unique_lock<std::recursive_mutex> *)in_stack_fffffffffffffd40);
    }
  }
  return;
}

Assistant:

void raft_server::yield_leadership(bool immediate_yield,
                                   int successor_id)
{
    // Leader reelection is already happening.
    if (write_paused_) return;

    // Not a leader, do nothing.
    if (id_ != leader_) return;

    // This node is the only node, do nothing.
    if (get_num_voting_members() <= 1) {
        p_er("this node is the only node in the cluster, will do nothing");
        return;
    }

    recur_lock(lock_);

    if (immediate_yield) {
        p_in("got immediate re-elect request, resign now");
        leader_ = -1;
        become_follower();
        // Clear live flag to avoid pre-vote rejection.
        hb_alive_ = false;
        return;
    }

    // Not immediate yield, nominate the successor.
    int max_priority = 0;
    int candidate_id = -1;
    uint64_t last_resp_ms = 0;
    std::string candidate_endpoint;
    size_t hb_interval_ms = ctx_->get_params()->heart_beat_interval_;
    if (successor_id >= 0) {
        // If successor is given, find that one.
        auto entry = peers_.find(successor_id);
        if (entry != peers_.end()) {
            int32 srv_id = entry->first;
            ptr<peer>& pp = entry->second;
            max_priority = pp->get_config().get_priority();
            candidate_id = srv_id;
            candidate_endpoint = pp->get_config().get_endpoint();
            last_resp_ms = pp->get_resp_timer_us() / 1000;
        }
    }

    // Successor is not given or the given successor is incorrect,
    // find the highest priority node whose response time is not expired.
    if (candidate_id == -1) {
        for (auto& entry: peers_) {
            int32 srv_id = entry.first;
            ptr<peer>& pp = entry.second;
            uint64_t pp_last_resp_ms = pp->get_resp_timer_us() / 1000;

            if ( srv_id != id_ &&
                 pp_last_resp_ms <= hb_interval_ms &&
                 pp->get_config().get_priority() > max_priority ) {
                max_priority = pp->get_config().get_priority();
                candidate_id = srv_id;
                candidate_endpoint = pp->get_config().get_endpoint();
                last_resp_ms = pp_last_resp_ms;
            }
        }
    }

    if (successor_id >= 0) {
        p_in("got graceful re-elect request (designated successor %d), "
             "pause write from now",
             successor_id);

        if ( successor_id >= 0 &&
             successor_id != candidate_id ) {
            p_wn("could not find given successor %d", successor_id);
        }

    } else {
        p_in("got graceful re-elect request, pause write from now");
    }

    if (candidate_id > -1) {
        p_in("next leader candidate: id %d endpoint %s priority %d "
             "last response %" PRIu64 " ms ago",
             candidate_id, candidate_endpoint.c_str(), max_priority,
             last_resp_ms);
        next_leader_candidate_ = candidate_id;;
    } else {
        p_wn("cannot find valid candidate for next leader, will proceed anyway");
    }

    // Reset reelection timer, and pause write.
    write_paused_ = true;

    // Wait until election timeout upper bound.
    reelection_timer_.set_duration_ms
                      ( ctx_->get_params()->election_timeout_upper_bound_ );
    reelection_timer_.reset();
}